

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::ConfigINI::to_config
          (string *__return_storage_ptr__,ConfigINI *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  size_type *psVar1;
  char cVar2;
  App *pAVar3;
  size_type sVar4;
  size_type sVar5;
  int iVar6;
  ostream *poVar7;
  string *psVar8;
  unsigned_long __val;
  pointer ppAVar9;
  string value;
  string name;
  stringstream out;
  allocator local_301;
  undefined1 local_300 [32];
  pointer local_2e0;
  _Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_2d8;
  string *local_2c0;
  string local_2b8;
  _Any_data local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  string *local_270;
  App *local_268;
  ConfigINI *local_260;
  string local_258;
  _Any_data local_238;
  undefined8 local_228;
  undefined8 uStack_220;
  string local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_2c0 = prefix;
  local_270 = __return_storage_ptr__;
  local_260 = this;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_238._M_unused._M_object = (void *)0x0;
  local_238._8_8_ = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_268 = app;
  App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)&local_2d8,
                   app,(function<bool_(const_CLI::Option_*)> *)&local_238);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_238);
  local_2e0 = local_2d8._M_impl.super__Vector_impl_data._M_finish;
  ppAVar9 = local_2d8._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppAVar9 == local_2e0) {
      std::_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~_Vector_base
                ((_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                 &local_2d8);
      local_288 = 0;
      uStack_280 = 0;
      local_298._M_unused._M_object = (void *)0x0;
      local_298._8_8_ = 0;
      App::get_subcommands
                ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)&local_2d8,local_268
                 ,(function<bool_(const_CLI::App_*)> *)&local_298);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_298);
      local_2e0 = local_2d8._M_impl.super__Vector_impl_data._M_finish;
      for (ppAVar9 = local_2d8._M_impl.super__Vector_impl_data._M_start; ppAVar9 != local_2e0;
          ppAVar9 = ppAVar9 + 1) {
        pAVar3 = *ppAVar9;
        ::std::__cxx11::string::string((string *)&local_2b8,(string *)&pAVar3->name_);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_300,local_2c0,&local_2b8);
        ::std::operator+(&local_1d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_300,".");
        (**(local_260->super_Config)._vptr_Config)
                  (&local_298,local_260,pAVar3,(ulong)default_also,(ulong)write_description,
                   &local_1d8);
        ::std::operator<<(local_1a8,(string *)local_298._M_pod_data);
        ::std::__cxx11::string::~string((string *)local_298._M_pod_data);
        ::std::__cxx11::string::~string((string *)&local_1d8);
        ::std::__cxx11::string::~string((string *)local_300);
        ::std::__cxx11::string::~string((string *)&local_2b8);
      }
      std::_Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~_Vector_base
                (&local_2d8);
      psVar8 = local_270;
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream(local_1b8);
      return psVar8;
    }
    pAVar3 = *ppAVar9;
    __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&(pAVar3->description_).field_2 + 8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_298,__x);
    if (local_298._M_unused._M_object == (void *)local_298._8_8_) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_298);
    }
    else {
      cVar2 = *(undefined1 *)((long)&(pAVar3->name_).field_2 + 0xb);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_298);
      if (cVar2 == '\x01') {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_300,__x);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_298,local_2c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_300._0_8_);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_300);
        local_300._0_8_ = local_300 + 0x10;
        local_300._8_8_ = (pointer)0x0;
        local_300[0x10] = '\0';
        sVar4 = (pAVar3->group_).field_2._M_allocated_capacity;
        sVar5 = *(size_type *)((long)&(pAVar3->group_).field_2 + 8);
        if (*(int *)((long)&(pAVar3->failure_message_).super__Function_base._M_functor + 0xc) == 0)
        {
          if (sVar5 - sVar4 == 0x20) {
LAB_0015ef3d:
            ::std::__cxx11::string::assign(local_300);
          }
          else {
            __val = (long)(sVar5 - sVar4) >> 5;
            if (__val < 2) {
              if (sVar5 == sVar4 && default_also) goto LAB_0015ef3d;
            }
            else {
              ::std::__cxx11::to_string((string *)&local_2b8,__val);
              ::std::__cxx11::string::operator=((string *)local_300,(string *)&local_2b8);
LAB_0015efca:
              ::std::__cxx11::string::~string((string *)&local_2b8);
            }
          }
        }
        else if (sVar5 == sVar4) {
          if (default_also) {
            psVar1 = &(pAVar3->footer_)._M_string_length;
            ::std::__cxx11::string::string((string *)&local_2b8,(string *)psVar1);
            sVar4 = local_2b8._M_string_length;
            ::std::__cxx11::string::~string((string *)&local_2b8);
            if (sVar4 != 0) {
              ::std::__cxx11::string::string((string *)&local_2b8,(string *)psVar1);
              ::std::__cxx11::string::operator=((string *)local_300,(string *)&local_2b8);
              goto LAB_0015efca;
            }
          }
        }
        else {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_1f0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&(pAVar3->group_).field_2);
          detail::ini_join(&local_2b8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_1f0);
          ::std::__cxx11::string::operator=((string *)local_300,(string *)&local_2b8);
          ::std::__cxx11::string::~string((string *)&local_2b8);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1f0);
        }
        if ((pointer)local_300._8_8_ != (pointer)0x0) {
          if ((write_description) && (((string *)&pAVar3->options_)->_M_string_length != 0)) {
            iVar6 = ::std::ostream::tellp();
            if (iVar6 != 0) {
              ::std::endl<char,std::char_traits<char>>(local_1a8);
            }
            poVar7 = ::std::operator<<(local_1a8,"; ");
            ::std::__cxx11::string::string((string *)&local_258,"; ",&local_301);
            ::std::__cxx11::string::string((string *)&local_210,(string *)&pAVar3->options_);
            detail::fix_newlines(&local_2b8,&local_258,&local_210);
            poVar7 = ::std::operator<<(poVar7,(string *)&local_2b8);
            ::std::endl<char,std::char_traits<char>>(poVar7);
            ::std::__cxx11::string::~string((string *)&local_2b8);
            ::std::__cxx11::string::~string((string *)&local_210);
            ::std::__cxx11::string::~string((string *)&local_258);
          }
          iVar6 = Option::get_items_expected((Option *)pAVar3);
          if (iVar6 == 1) {
            poVar7 = ::std::operator<<(local_1a8,(string *)local_298._M_pod_data);
            poVar7 = ::std::operator<<(poVar7,"=");
            psVar8 = detail::add_quotes_if_needed((string *)local_300);
          }
          else {
            poVar7 = ::std::operator<<(local_1a8,(string *)local_298._M_pod_data);
            poVar7 = ::std::operator<<(poVar7,"=");
            psVar8 = (string *)local_300;
          }
          poVar7 = ::std::operator<<(poVar7,(string *)psVar8);
          ::std::endl<char,std::char_traits<char>>(poVar7);
        }
        ::std::__cxx11::string::~string((string *)local_300);
        ::std::__cxx11::string::~string((string *)local_298._M_pod_data);
      }
    }
    ppAVar9 = ppAVar9 + 1;
  } while( true );
}

Assistant:

inline std::string
ConfigINI::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    for(const Option *opt : app->get_options({})) {

        // Only process option with a long-name and configurable
        if(!opt->get_lnames().empty() && opt->get_configurable()) {
            std::string name = prefix + opt->get_lnames()[0];
            std::string value;

            // Non-flags
            if(opt->get_type_size() != 0) {

                // If the option was found on command line
                if(opt->count() > 0)
                    value = detail::ini_join(opt->results());

                // If the option has a default and is requested by optional argument
                else if(default_also && !opt->get_defaultval().empty())
                    value = opt->get_defaultval();
                // Flag, one passed
            } else if(opt->count() == 1) {
                value = "true";

                // Flag, multiple passed
            } else if(opt->count() > 1) {
                value = std::to_string(opt->count());

                // Flag, not present
            } else if(opt->count() == 0 && default_also) {
                value = "false";
            }

            if(!value.empty()) {
                if(write_description && opt->has_description()) {
                    if(static_cast<int>(out.tellp()) != 0) {
                        out << std::endl;
                    }
                    out << "; " << detail::fix_newlines("; ", opt->get_description()) << std::endl;
                }

                // Don't try to quote anything that is not size 1
                if(opt->get_items_expected() != 1)
                    out << name << "=" << value << std::endl;
                else
                    out << name << "=" << detail::add_quotes_if_needed(value) << std::endl;
            }
        }
    }

    for(const App *subcom : app->get_subcommands({}))
        out << to_config(subcom, default_also, write_description, prefix + subcom->get_name() + ".");

    return out.str();
}